

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_MeshPart>::Append(ON_SimpleArray<ON_MeshPart> *this,ON_MeshPart *x)

{
  int iVar1;
  ON_MeshPart *pOVar2;
  undefined8 uVar3;
  ON_MeshPart *pOVar4;
  ON_MeshPart *memblock;
  int iVar5;
  uint uVar6;
  
  iVar1 = this->m_count;
  memblock = x;
  if (iVar1 == this->m_capacity) {
    if ((iVar1 < 8) || ((ulong)((long)iVar1 * 0x18) < 0x10000001)) {
      uVar6 = 4;
      if (2 < iVar1) {
        uVar6 = iVar1 * 2;
      }
    }
    else {
      iVar5 = 0xaaaab2;
      if (iVar1 < 0xaaaab2) {
        iVar5 = iVar1;
      }
      uVar6 = iVar5 + iVar1;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_MeshPart *)onmalloc(0x18);
      uVar3 = *(undefined8 *)x->fi;
      *(undefined8 *)memblock->vi = *(undefined8 *)x->vi;
      *(undefined8 *)memblock->fi = uVar3;
      iVar1 = x->triangle_count;
      memblock->vertex_count = x->vertex_count;
      memblock->triangle_count = iVar1;
    }
    if ((uint)this->m_capacity < uVar6) {
      SetCapacity(this,(long)(int)uVar6);
    }
    if (this->m_a == (ON_MeshPart *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pOVar2 = this->m_a;
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  iVar5 = memblock->triangle_count;
  pOVar4 = pOVar2 + iVar1;
  pOVar4->vertex_count = memblock->vertex_count;
  pOVar4->triangle_count = iVar5;
  uVar3 = *(undefined8 *)memblock->fi;
  pOVar2 = pOVar2 + iVar1;
  *(undefined8 *)pOVar2->vi = *(undefined8 *)memblock->vi;
  *(undefined8 *)pOVar2->fi = uVar3;
  if (memblock != x) {
    onfree(memblock);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}